

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::TestSpec::Filter::name_abi_cxx11_(string *__return_storage_ptr__,Filter *this)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<Catch::TestSpec::Pattern> *p;
  pointer psVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (this->m_patterns).
           super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->m_patterns).
                super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_append(__return_storage_ptr__,(peVar2->m_name)._M_dataplus._M_p,
              (peVar2->m_name)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestSpec::Filter::name() const {
    std::string name;
    for (auto const &p : m_patterns)
      name += p->name();
    return name;
  }